

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void lts2::ImageWaveletScale(Mat *src,Mat *dest,double *P,double *Q,int fsize,int scale,int *rscale)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  double dVar4;
  uint n;
  uint n_00;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  _InputArray *p_Var9;
  reference pvVar10;
  pointer pMVar11;
  int k;
  uint uVar12;
  pointer pMVar13;
  ulong uVar14;
  int b;
  uint uVar15;
  int j;
  double *pdVar16;
  ulong uVar17;
  uint uVar18;
  double dVar19;
  float local_404;
  double *local_400;
  ulong local_3f8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  vector<cv::Mat,_std::allocator<cv::Mat>_> dest_components;
  undefined8 local_398;
  undefined8 local_378;
  Scalar_<double> local_370;
  Mat ret;
  _InputArray local_2f0 [14];
  _OutputArray local_190 [14];
  
  cv::Mat::Mat(&ret);
  uVar3 = **(undefined8 **)(src + 0x40);
  local_190[0].super__InputArray.obj = &components;
  components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dest_components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0[0].sz.width = 0;
  local_2f0[0].sz.height = 0;
  local_190[0].super__InputArray.sz.width = 0;
  local_190[0].super__InputArray.sz.height = 0;
  local_2f0[0].flags = 0x1010000;
  local_190[0].super__InputArray.flags = 0x2050000;
  local_2f0[0].obj = src;
  cv::split(local_2f0,local_190);
  pMVar13 = components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar11 = components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar6 = ((long)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x60;
  uVar6 = -(ulong)(uVar6 >> 0x3d != 0) | uVar6 << 3;
  pdVar7 = (double *)operator_new__(uVar6);
  pdVar8 = (double *)operator_new__(uVar6);
  pdVar16 = pdVar7;
  local_400 = pdVar8;
  for (uVar6 = 0; uVar6 < (ulong)(((long)pMVar11 - (long)pMVar13) / 0x60); uVar6 = uVar6 + 1) {
    local_2f0[0].obj = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
    local_2f0[0].sz.width = 0;
    local_2f0[0].sz.height = 0;
    local_2f0[0].flags = 0x1010000;
    p_Var9 = (_InputArray *)cv::noArray();
    cv::minMaxLoc(local_2f0,pdVar16,local_400,(Point_ *)0x0,(Point_ *)0x0,p_Var9);
    pdVar16 = pdVar16 + 1;
    local_400 = local_400 + 1;
    pMVar13 = components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar11 = components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  n = *(uint *)(src + 0xc);
  iVar5 = 1;
  for (n_00 = *(uint *)(src + 8);
      (((local_3f8 = (ulong)n_00, local_400 = (double *)(ulong)n, iVar5 <= scale &&
        (fsize <= (int)n)) && (fsize <= (int)n_00)) && (((n & 1) == 0 && ((n_00 & 1) == 0))));
      n_00 = (int)n_00 >> 1) {
    uVar15 = 0;
    if (0 < (int)n_00) {
      uVar15 = n_00;
    }
    uVar18 = 0;
    if (0 < (int)n) {
      uVar18 = n;
    }
    for (uVar6 = 0; uVar6 < (ulong)(((long)pMVar11 - (long)pMVar13) / 0x60); uVar6 = uVar6 + 1) {
      for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
        Wavegeneral_h(pvVar10,uVar12,n,0,P,Q,fsize);
      }
      for (uVar12 = 0; uVar18 != uVar12; uVar12 = uVar12 + 1) {
        pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
        Wavegeneral_v(pvVar10,uVar12,n_00,0,P,Q,fsize);
      }
      pMVar13 = components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar11 = components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    n = (int)n >> 1;
    iVar5 = iVar5 + 1;
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve
            (&dest_components,((long)pMVar11 - (long)pMVar13) / 0x60);
  uVar6 = 0;
  if ((int)n < 1) {
    local_400 = (double *)uVar6;
  }
  if ((int)n_00 < 1) {
    local_3f8 = uVar6;
  }
  local_398._0_4_ = (undefined4)uVar3;
  local_398._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_398 = CONCAT44((undefined4)local_398,local_398._4_4_);
  while( true ) {
    if ((ulong)(((long)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x60) <= uVar6) break;
    pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
    local_404 = **(float **)(pvVar10 + 0x10);
    pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&dest_components,uVar6);
    local_378 = local_398;
    cv::Mat::create(pvVar10,&local_378,5);
    fVar2 = local_404;
    for (uVar17 = 0; uVar17 != local_3f8; uVar17 = uVar17 + 1) {
      for (uVar14 = 0; local_400 != (double *)uVar14; uVar14 = uVar14 + 1) {
        pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
        if (*(float *)(**(long **)(pvVar10 + 0x48) * uVar17 + *(long *)(pvVar10 + 0x10) + uVar14 * 4
                      ) <= local_404) {
          pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
          local_404 = *(float *)(**(long **)(pvVar10 + 0x48) * uVar17 + *(long *)(pvVar10 + 0x10) +
                                uVar14 * 4);
        }
        pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
        pfVar1 = (float *)(**(long **)(pvVar10 + 0x48) * uVar17 + *(long *)(pvVar10 + 0x10) +
                          uVar14 * 4);
        if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
          pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
          fVar2 = *(float *)(**(long **)(pvVar10 + 0x48) * uVar17 + *(long *)(pvVar10 + 0x10) +
                            uVar14 * 4);
        }
      }
    }
    dVar19 = pdVar8[uVar6];
    dVar4 = pdVar7[uVar6];
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,uVar6);
    dVar19 = dVar19 - dVar4;
    cv::operator*((double)(float)(dVar19 / (double)(fVar2 - local_404)),(Mat *)local_190);
    cv::Scalar_<double>::Scalar_
              (&local_370,
               (double)(float)(dVar4 - (dVar19 * (double)local_404) / (double)(fVar2 - local_404)));
    cv::operator+((MatExpr *)local_2f0,(Scalar_ *)local_190);
    pvVar10 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&dest_components,uVar6);
    (**(code **)(*(long *)CONCAT44(local_2f0[0]._4_4_,local_2f0[0].flags) + 0x18))
              ((long *)CONCAT44(local_2f0[0]._4_4_,local_2f0[0].flags),local_2f0,pvVar10,
               0xffffffffffffffff);
    cv::MatExpr::~MatExpr((MatExpr *)local_2f0);
    cv::MatExpr::~MatExpr((MatExpr *)local_190);
    uVar6 = uVar6 + 1;
  }
  local_2f0[0].sz.width = 0;
  local_2f0[0].sz.height = 0;
  local_190[0].super__InputArray.sz.width = 0;
  local_190[0].super__InputArray.sz.height = 0;
  local_2f0[0].flags = 0x1050000;
  local_190[0].super__InputArray.flags = 0x2010000;
  local_2f0[0].obj = &dest_components;
  local_190[0].super__InputArray.obj = dest;
  cv::merge(local_2f0,local_190);
  iVar5 = iVar5 + -1;
  if (scale == 0) {
    iVar5 = 0;
  }
  *rscale = iVar5;
  operator_delete__(pdVar7);
  operator_delete__(pdVar8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&dest_components);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&components);
  cv::Mat::~Mat(&ret);
  return;
}

Assistant:

void lts2::ImageWaveletScale(const cv::Mat& src, cv::Mat& dest, double *P, double *Q, int fsize, int scale, int *rscale)
{
  cv::Mat ret;
  float *min, *max, a, c;
	
  cv::Size imageSize = src.size();
        
  std::vector<cv::Mat> components, dest_components;
  cv::split(src, components);
    
  double *omin = new double[components.size()];
  double *omax = new double[components.size()];
    
  for (int b = 0; b < components.size(); ++b)
    cv::minMaxLoc(components.at(b), &omin[b], &omax[b]);
	
  int width = src.cols;
  int height = src.rows;
  int num = 1;
	
  while(num<=scale && width>=fsize && height>=fsize && !(width%2) && !(height%2)) 
  {
    for (int b = 0; b < components.size(); ++b) 
    {
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, 0, P, Q, fsize);
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, 0, P, Q, fsize);
    }
    width /= 2; 
    height /= 2;
    ++num;
  }
    
  dest_components.reserve(components.size());
    	
  min = new float[components.size()];
  max = new float[components.size()];
    
  for (int b = 0; b < components.size(); ++b) 
  {
    min[b] = max[b] = components.at(b).at<float>(0, 0);
    dest_components.at(b).create(imageSize, CV_32FC1);
        
    for(int j = 0; j < height; ++j) 
    {
      for(int i = 0; i < width; ++i) 
      {
        min[b] = MIN(components.at(b).at<float>(j, i), min[b]);
        max[b] = MAX(components.at(b).at<float>(j, i), max[b]);
      }
    }
    a = (omax[b] - omin[b]) / (max[b] - min[b]);
    c = omin[b] - min[b]*(omax[b] - omin[b]) / (max[b] - min[b]);
        
    dest_components.at(b) = a * components.at(b) + c;
  }
    
  cv::merge(dest_components, dest);
    
  if (scale != 0) 
    *rscale = num - 1;
  else 
    *rscale = 0;
    
  delete[] min;
  delete[] max;
  delete[] omin;
  delete[] omax;
	
  return;
}